

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToJitExecutionMode
          (FunctionExecutionStateMachine *this)

{
  ExecutionMode EVar1;
  ExecutionMode EVar2;
  bool bVar3;
  
  EVar1 = GetExecutionMode(this);
  TryTransitionToNextExecutionMode(this);
  EVar2 = GetExecutionMode(this);
  if (EVar2 == SimpleJit) {
LAB_006e57ab:
    EVar2 = GetExecutionMode(this);
    bVar3 = true;
    if (EVar2 != EVar1) {
      FunctionBody::TraceExecutionMode((this->owner).ptr,(char *)0x0);
    }
  }
  else {
    if (EVar2 == FullJit) {
      if (this->fullJitRequeueThreshold == 0) goto LAB_006e57ab;
      this->fullJitRequeueThreshold = this->fullJitRequeueThreshold - 1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToJitExecutionMode()
    {
        const ExecutionMode previousExecutionMode = GetExecutionMode();

        TryTransitionToNextExecutionMode();
        switch (GetExecutionMode())
        {
        case ExecutionMode::SimpleJit:
            break;

        case ExecutionMode::FullJit:
            if (fullJitRequeueThreshold == 0)
            {
                break;
            }
            --fullJitRequeueThreshold;
            return false;

        default:
            return false;
        }

        if (GetExecutionMode() != previousExecutionMode)
        {
            owner->TraceExecutionMode();
        }
        return true;
    }